

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

void __thiscall UniValue::setFloat(UniValue *this,double val_)

{
  _Setprecision _Var1;
  ostream *this_00;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  string *in_XMM0_Qa;
  ostringstream oss;
  int in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  ostream local_180;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_180);
  _Var1 = std::setprecision(in_stack_fffffffffffffe18);
  this_00 = std::operator<<(&local_180,_Var1);
  std::ostream::operator<<(this_00,(double)in_XMM0_Qa);
  std::__cxx11::ostringstream::str();
  setNumStr(in_RDI,in_XMM0_Qa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::setFloat(double val_)
{
    std::ostringstream oss;

    oss << std::setprecision(16) << val_;

    return setNumStr(oss.str());
}